

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O2

SignalBase<int> * __thiscall
dynamicgraph::SignalPtr<double,_int>::getAbstractPtr(SignalPtr<double,_int> *this)

{
  int iVar1;
  Signal<double,_int> *pSVar2;
  ExceptionSignal *this_00;
  allocator<char> local_3d;
  ErrorCodeEnum local_3c;
  string local_38 [32];
  
  iVar1 = (*this->_vptr_SignalPtr[6])();
  if ((char)iVar1 != '\0') {
    pSVar2 = this->signalPtr;
    if (pSVar2 == (Signal<double,_int> *)0x0) {
      pSVar2 = (Signal<double,_int> *)this->abstractTransmitter;
    }
    return &pSVar2->super_SignalBase<int>;
  }
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_3c = NOT_INITIALIZED;
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"In SignalPtr: SIN ptr not set.",&local_3d);
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_3c,local_38," (in signal <%s>)",
             *(undefined8 *)((long)&this->signalPtr + (long)this->_vptr_SignalPtr[-3]));
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

const SignalBase<Time> *SignalPtr<T, Time>::getAbstractPtr() const {
  if (!isAbstractPluged()) {
    DG_THROW ExceptionSignal(ExceptionSignal::NOT_INITIALIZED,
                             "In SignalPtr: SIN ptr not set.",
                             " (in signal <%s>)", getName().c_str());
  }
  if (NULL != signalPtr)
    return signalPtr;
  else
    return abstractTransmitter;
}